

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen15Private.cpp
# Opt level: O1

bool __thiscall
COLLADASaxFWL15::ColladaParserAutoGen15Private::_preBegin__ref_attachment
          (ColladaParserAutoGen15Private *this,ParserAttributes *attributes,void **attributeDataPtr,
          void **validationDataPtr)

{
  URI *this_00;
  ParserChar *text;
  bool bVar1;
  bool bVar2;
  byte *pbVar3;
  StringHash SVar4;
  int iVar5;
  xmlChar **ppxVar6;
  bool failed;
  ParserChar *attributeValue;
  bool local_121;
  ParserChar *local_120;
  URI local_118;
  
  pbVar3 = (byte *)GeneratedSaxParser::StackMemoryManager::newObject
                             (&(this->
                               super_ParserTemplate<COLLADASaxFWL15::ColladaParserAutoGen15Private,_COLLADASaxFWL15::ColladaParserAutoGen15>
                               ).super_ParserTemplateBase.mStackMemoryManager,0xf0);
  *(undefined4 *)pbVar3 = ref_attachment__AttributeData::DEFAULT;
  this_00 = (URI *)(pbVar3 + 8);
  COLLADABU::URI::URI(this_00,(URI *)&DAT_009ec170,false);
  *attributeDataPtr = pbVar3;
  ppxVar6 = attributes->attributes;
  if (ppxVar6 != (xmlChar **)0x0) {
    do {
      text = *ppxVar6;
      if (text == (ParserChar *)0x0) {
        iVar5 = 3;
      }
      else {
        SVar4 = GeneratedSaxParser::Utils::calculateStringHash(text);
        local_120 = ppxVar6[1];
        if (SVar4 == 0xfa21a69) {
          GeneratedSaxParser::Utils::toURI(&local_118,&local_120,&local_121);
          COLLADABU::URI::operator=(this_00,&local_118);
          COLLADABU::URI::~URI(&local_118);
          if (local_121 == true) {
            bVar2 = false;
            bVar1 = GeneratedSaxParser::ParserTemplateBase::handleError
                              ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                               ERROR_ATTRIBUTE_PARSING_FAILED,0xc5cb874,0xfa21a69,local_120);
            if (!bVar1) goto LAB_0074c383;
            iVar5 = 1;
          }
          else {
LAB_0074c383:
            iVar5 = 4;
            bVar2 = true;
            if (local_121 == false) {
              *pbVar3 = *pbVar3 | 1;
            }
          }
          if (bVar2) {
LAB_0074c373:
            iVar5 = 0;
          }
        }
        else {
          bVar2 = GeneratedSaxParser::ParserTemplateBase::handleError
                            ((ParserTemplateBase *)this,SEVERITY_ERROR_NONCRITICAL,
                             ERROR_UNKNOWN_ATTRIBUTE,0xc5cb874,text,local_120);
          iVar5 = 1;
          if (!bVar2) goto LAB_0074c373;
        }
        ppxVar6 = ppxVar6 + 2;
      }
    } while (iVar5 == 0);
    if (iVar5 != 3) {
      return false;
    }
  }
  if ((*pbVar3 & 1) == 0) {
    COLLADABU::URI::URI(&local_118,"");
    COLLADABU::URI::operator=(this_00,&local_118);
    COLLADABU::URI::~URI(&local_118);
  }
  return true;
}

Assistant:

bool ColladaParserAutoGen15Private::_preBegin__ref_attachment( const ParserAttributes& attributes, void ** attributeDataPtr, void ** validationDataPtr )
{
#ifdef GENERATEDSAXPARSER_VALIDATION
    if ( mValidate )
    {

        bool validationResult = _validateBegin__ref_attachment( attributes, attributeDataPtr, validationDataPtr );
        if ( !validationResult ) return false;

    } // validation
#endif

ref_attachment__AttributeData* attributeData = newData<ref_attachment__AttributeData>(attributeDataPtr);

const ParserChar** attributeArray = attributes.attributes;
if ( attributeArray )
{
    while (true)
    {
        const ParserChar * attribute = *attributeArray;
        if ( !attribute )
            break;
        StringHash hash = GeneratedSaxParser::Utils::calculateStringHash(attribute);
        attributeArray++;
        if ( !attributeArray )
            return false;
        const ParserChar* attributeValue = *attributeArray;
        attributeArray++;


    switch ( hash )
    {
    case HASH_ATTRIBUTE_RIGID_BODY:
    {
bool failed;
attributeData->rigid_body = GeneratedSaxParser::Utils::toURI(&attributeValue, failed);
if ( failed && handleError(ParserError::SEVERITY_ERROR_NONCRITICAL,
        ParserError::ERROR_ATTRIBUTE_PARSING_FAILED,
        HASH_ELEMENT_REF_ATTACHMENT,
        HASH_ATTRIBUTE_RIGID_BODY,
        attributeValue))
{
    return false;
}
if ( !failed )
    attributeData->present_attributes |= ref_attachment__AttributeData::ATTRIBUTE_RIGID_BODY_PRESENT;

    break;
    }
    default:
    {
        if ( handleError(ParserError::SEVERITY_ERROR_NONCRITICAL, ParserError::ERROR_UNKNOWN_ATTRIBUTE, HASH_ELEMENT_REF_ATTACHMENT, attribute, attributeValue))
            {return false;}
    }
    }
    }
}
if ((attributeData->present_attributes & ref_attachment__AttributeData::ATTRIBUTE_RIGID_BODY_PRESENT) == 0)
{
    attributeData->rigid_body = COLLADABU::URI("");
}


    return true;
}